

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * capnp::_::WireHelpers::followFarsNoWritableCheck
                 (WirePointer **ref,word *refTarget,SegmentBuilder **segment)

{
  bool bVar1;
  Kind KVar2;
  Id<unsigned_int,_capnp::_::Segment> IVar3;
  BuilderArena *pBVar4;
  SegmentBuilder *pSVar5;
  WirePointer *this;
  WirePointer *pad;
  SegmentBuilder **segment_local;
  word *refTarget_local;
  WirePointer **ref_local;
  
  KVar2 = WirePointer::kind(*ref);
  ref_local = (WirePointer **)refTarget;
  if (KVar2 == FAR) {
    pBVar4 = SegmentBuilder::getArena(*segment);
    IVar3 = DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                      ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                       &((*ref)->field_1).structRef);
    pSVar5 = BuilderArena::getSegment(pBVar4,(SegmentId)IVar3.value);
    *segment = pSVar5;
    this = (WirePointer *)WirePointer::farTarget(*ref,*segment);
    bVar1 = WirePointer::isDoubleFar(*ref);
    if (bVar1) {
      *ref = this + 1;
      pBVar4 = SegmentBuilder::getArena(*segment);
      IVar3 = DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                        ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                         &(this->field_1).structRef);
      pSVar5 = BuilderArena::getSegment(pBVar4,(SegmentId)IVar3.value);
      *segment = pSVar5;
      ref_local = (WirePointer **)WirePointer::farTarget(this,*segment);
    }
    else {
      *ref = this;
      ref_local = (WirePointer **)WirePointer::target(this);
    }
  }
  return (word *)ref_local;
}

Assistant:

static KJ_ALWAYS_INLINE(word* followFarsNoWritableCheck(
      WirePointer*& ref, word* refTarget, SegmentBuilder*& segment)) {
    // If `ref` is a far pointer, follow it.  On return, `ref` will have been updated to point at
    // a WirePointer that contains the type information about the target object, and a pointer to
    // the object contents is returned.  The caller must NOT use `ref->target()` as this may or may
    // not actually return a valid pointer.  `segment` is also updated to point at the segment which
    // actually contains the object.
    //
    // If `ref` is not a far pointer, this simply returns `refTarget`.  Usually, `refTarget` should
    // be the same as `ref->target()`, but may not be in cases where `ref` is only a tag.

    if (ref->kind() == WirePointer::FAR) {
      segment = segment->getArena()->getSegment(ref->farRef.segmentId.get());
      WirePointer* pad = reinterpret_cast<WirePointer*>(ref->farTarget(segment));
      if (!ref->isDoubleFar()) {
        ref = pad;
        return pad->target();
      }

      // Landing pad is another far pointer.  It is followed by a tag describing the pointed-to
      // object.
      ref = pad + 1;

      segment = segment->getArena()->getSegment(pad->farRef.segmentId.get());
      return pad->farTarget(segment);
    } else {
      return refTarget;
    }
  }